

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testArgumentParser.cxx
# Opt level: O0

Continue __thiscall anon_unknown.dwarf_140f6::Result::Func1(Result *this,string_view arg)

{
  allocator<char> local_41;
  string local_40 [32];
  Result *local_20;
  Result *this_local;
  string_view arg_local;
  
  arg_local._M_len = (size_t)arg._M_str;
  this_local = (Result *)arg._M_len;
  local_20 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_40,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_41);
  std::__cxx11::string::operator=((string *)&this->Func1_,local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  return No;
}

Assistant:

ArgumentParser::Continue Func1(cm::string_view arg)
  {
    Func1_ = std::string(arg);
    return ArgumentParser::Continue::No;
  }